

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O2

string * __thiscall
adios2::format::BP4Base::GetBPVersionFileName
          (string *__return_storage_ptr__,BP4Base *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string bpName;
  
  helper::RemoveTrailingSlash(&bpName,name);
  std::operator+(&local_50,&bpName,'/');
  std::operator+(__return_storage_ptr__,&local_50,".bpversion");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&bpName);
  return __return_storage_ptr__;
}

Assistant:

std::string BP4Base::GetBPVersionFileName(const std::string &name) const noexcept
{
    const std::string bpName = helper::RemoveTrailingSlash(name);
    /* the name of the version file is ".bpversion" */
    const std::string bpVersionFileName(bpName + PathSeparator + ".bpversion");
    return bpVersionFileName;
}